

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_107107::CreateStore
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,VmValue *value,uint offset)

{
  VariableData *pVVar1;
  Allocator *pAVar2;
  int iVar3;
  VmInstructionType VVar4;
  TypeRef *pTVar5;
  VmConstant *pVVar6;
  VmValue *pVVar7;
  undefined4 extraout_var;
  VmInstruction *pVVar8;
  uint dstOffset;
  uint srcOffset;
  VmInstructionType cmd;
  VmType VVar9;
  VmValue *in_stack_ffffffffffffffb8;
  
  VVar9 = GetVmType(ctx,type);
  if (((value->type).type != VVar9.type) || ((value->type).size != VVar9.size)) {
    __assert_fail("value->type == GetVmType(ctx, type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x37f,
                  "VmValue *(anonymous namespace)::CreateStore(ExpressionContext &, VmModule *, SynBase *, TypeBase *, VmValue *, VmValue *, unsigned int)"
                 );
  }
  if (type->size == 0) {
    iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98,VVar9.structType);
    pVVar8 = (VmInstruction *)CONCAT44(extraout_var,iVar3);
    pAVar2 = module->allocator;
    (pVVar8->super_VmValue).typeID = 0;
    (pVVar8->super_VmValue).source = (SynBase *)0x0;
    (pVVar8->super_VmValue).comment.begin = (char *)0x0;
    (pVVar8->super_VmValue).type.type = VM_TYPE_VOID;
    (pVVar8->super_VmValue).type.size = 0;
    (pVVar8->super_VmValue).type.structType = (TypeBase *)0x0;
    (pVVar8->super_VmValue).comment.end = (char *)0x0;
    (pVVar8->super_VmValue).users.allocator = pAVar2;
    (pVVar8->super_VmValue).users.data = (pVVar8->super_VmValue).users.little;
    (pVVar8->super_VmValue).users.count = 0;
    (pVVar8->super_VmValue).users.max = 8;
    (pVVar8->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar8->super_VmValue).hasSideEffects = false;
    (pVVar8->super_VmValue).hasMemoryAccess = false;
    (pVVar8->super_VmValue).canBeRemoved = true;
    (pVVar8->super_VmValue).hasKnownSimpleUse = false;
    (pVVar8->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00224c70;
  }
  else {
    if ((address == (VmValue *)0x0) || (address->typeID != 1)) {
      if ((value->typeID == 1) && (value[1].hasMemoryAccess == true)) {
        pAVar2 = ctx->allocator;
        iVar3 = *(int *)&value[1]._vptr_VmValue;
        pVVar1 = (VariableData *)value[1].comment.end;
        pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
        pVVar6 = CreateConstantPointer(pAVar2,source,iVar3,pVVar1,&pTVar5->super_TypeBase,true);
        srcOffset = (uint)type->size;
        dstOffset = offset;
        goto LAB_0019372d;
      }
      VVar4 = GetStoreInstruction(ctx,type);
      pVVar6 = CreateConstantInt(ctx->allocator,source,offset);
      cmd = (VmInstructionType)address;
    }
    else {
      in_stack_ffffffffffffffb8 = (VmValue *)module->allocator;
      iVar3 = *(int *)&address[1]._vptr_VmValue;
      pVVar1 = (VariableData *)address[1].comment.end;
      pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
      address = &CreateConstantPointer
                           ((Allocator *)in_stack_ffffffffffffffb8,source,offset + iVar3,pVVar1,
                            &pTVar5->super_TypeBase,true)->super_VmValue;
      if ((value->typeID == 1) && (value[1].hasMemoryAccess == true)) {
        pAVar2 = ctx->allocator;
        iVar3 = *(int *)&value[1]._vptr_VmValue;
        pVVar1 = (VariableData *)value[1].comment.end;
        pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
        pVVar6 = CreateConstantPointer(pAVar2,source,iVar3,pVVar1,&pTVar5->super_TypeBase,true);
        srcOffset = (uint)type->size;
        dstOffset = 0;
LAB_0019372d:
        pVVar7 = CreateMemCopy(module,source,address,dstOffset,&pVVar6->super_VmValue,srcOffset,
                               offset);
        return pVVar7;
      }
      VVar4 = GetStoreInstruction(ctx,type);
      pVVar6 = CreateConstantInt(ctx->allocator,source,0);
      cmd = (VmInstructionType)address;
    }
    pVVar8 = CreateInstruction((anon_unknown_dwarf_107107 *)module,(VmModule *)source,(SynBase *)0x0
                               ,(VmType)(ZEXT416(VVar4) << 0x40),cmd,&pVVar6->super_VmValue,value,
                               (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffffb8);
  }
  return &pVVar8->super_VmValue;
}

Assistant:

VmValue* CreateStore(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, VmValue *value, unsigned offset)
	{
		assert(value->type == GetVmType(ctx, type));

		if(type->size == 0)
			return CreateVoid(module);

		if(VmConstant *constantAddress = getType<VmConstant>(address))
		{
			VmConstant *shiftAddress = CreateConstantPointer(module->allocator, source, constantAddress->iValue + offset, constantAddress->container, ctx.GetReferenceType(type), true);

			if(VmConstant *constant = getType<VmConstant>(value))
			{
				if(constant->isReference)
				{
					VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

					return CreateMemCopy(module, source, shiftAddress, 0, pointer, 0, int(type->size));
				}
			}

			return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), shiftAddress, CreateConstantInt(ctx.allocator, source, 0), value);
		}

		if(VmConstant *constant = getType<VmConstant>(value))
		{
			if(constant->isReference)
			{
				VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

				return CreateMemCopy(module, source, address, offset, pointer, 0, int(type->size));
			}
		}

		return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset), value);
	}